

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

void __thiscall kj::Executor::Impl::disconnect(Impl *this)

{
  List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::replyLink> *this_00;
  anon_enum_32 *params_1;
  PromiseArenaMember *pPVar1;
  XThreadPaf *pXVar2;
  XThreadEvent *pXVar3;
  XThreadEvent *pXVar4;
  XThreadEvent *event_2;
  XThreadPaf *__filename;
  XThreadEvent *event;
  List<kj::_::XThreadPaf,_&kj::_::XThreadPaf::link> *this_01;
  DebugComparison<kj::_::XThreadEvent::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1865:3)_&,_kj::_::XThreadEvent::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1865:3)>
  _kjCondition;
  Fault f;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:848:5)>
  _kjDefer848;
  
  _kjCondition.left = (anon_enum_32 *)((ulong)_kjCondition.left & 0xffffffffffffff00);
  kj::_::Mutex::lock();
  (this->state).value.loop.ptr = (EventLoop *)0x0;
  kj::_::Mutex::unlock((Mutex *)this,EXCLUSIVE,(Waiter *)0x0);
  _kjDefer848.maybeFunc.ptr.isSet = true;
  pXVar4 = (this->state).value.start.head.ptr;
  _kjDefer848.maybeFunc.ptr.field_1 =
       (anon_union_8_1_a8c68091_for_NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:848:5)>_2
        )this;
  if (pXVar4 != (XThreadEvent *)0x0) {
    do {
      pXVar3 = (pXVar4->targetLink).next.ptr;
      _kjCondition.result = pXVar4->state == QUEUED;
      _kjCondition.left = &pXVar4->state;
      _kjCondition.right = QUEUED;
      _kjCondition.op.content.ptr = " == ";
      _kjCondition.op.content.size_ = 5;
      if (!_kjCondition.result) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<kj::_::XThreadEvent::_unnamed_type_1_&,_unnamed_type_1_>&,kj::_::XThreadEvent::_unnamed_type_1_>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
                   ,0x353,FAILED,"event.state == _::XThreadEvent::QUEUED","_kjCondition,event.state"
                   ,&_kjCondition,_kjCondition.left);
        kj::_::Debug::Fault::~Fault(&f);
      }
      List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink>::remove
                (&(this->state).value.start,(char *)pXVar4);
      kj::_::XThreadEvent::setDisconnected(pXVar4);
      kj::_::XThreadEvent::sendReply(pXVar4);
      pXVar4->state = DONE;
      pXVar4 = pXVar3;
    } while (pXVar3 != (XThreadEvent *)0x0);
  }
  pXVar4 = (this->state).value.executing.head.ptr;
  if (pXVar4 != (XThreadEvent *)0x0) {
    do {
      pXVar3 = (pXVar4->targetLink).next.ptr;
      _kjCondition.result = pXVar4->state == EXECUTING;
      _kjCondition.left = &pXVar4->state;
      _kjCondition.right = EXECUTING;
      _kjCondition.op.content.ptr = " == ";
      _kjCondition.op.content.size_ = 5;
      if (!_kjCondition.result) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<kj::_::XThreadEvent::_unnamed_type_1_&,_unnamed_type_1_>&,kj::_::XThreadEvent::_unnamed_type_1_>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
                   ,0x35b,FAILED,"event.state == _::XThreadEvent::EXECUTING",
                   "_kjCondition,event.state",&_kjCondition,_kjCondition.left);
        kj::_::Debug::Fault::~Fault(&f);
      }
      List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink>::remove
                (&(this->state).value.executing,(char *)pXVar4);
      pPVar1 = &((pXVar4->promiseNode).ptr.ptr)->super_PromiseArenaMember;
      (pXVar4->promiseNode).ptr.ptr = (PromiseNode *)0x0;
      if (pPVar1 != (PromiseArenaMember *)0x0) {
        kj::_::PromiseDisposer::dispose(pPVar1);
      }
      kj::_::XThreadEvent::setDisconnected(pXVar4);
      kj::_::XThreadEvent::sendReply(pXVar4);
      pXVar4->state = DONE;
      pXVar4 = pXVar3;
    } while (pXVar3 != (XThreadEvent *)0x0);
  }
  pXVar4 = (this->state).value.cancel.head.ptr;
  if (pXVar4 != (XThreadEvent *)0x0) {
    do {
      pXVar3 = (pXVar4->targetLink).next.ptr;
      _kjCondition.result = pXVar4->state == CANCELING;
      params_1 = &pXVar4->state;
      _kjCondition.right = CANCELING;
      _kjCondition.op.content.ptr = " == ";
      _kjCondition.op.content.size_ = 5;
      _kjCondition.left = params_1;
      if (!_kjCondition.result) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<kj::_::XThreadEvent::_unnamed_type_1_&,_unnamed_type_1_>&,kj::_::XThreadEvent::_unnamed_type_1_>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
                   ,0x364,FAILED,"event.state == _::XThreadEvent::CANCELING",
                   "_kjCondition,event.state",&_kjCondition,params_1);
        kj::_::Debug::Fault::~Fault(&f);
      }
      List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink>::remove
                (&(this->state).value.cancel,(char *)pXVar4);
      pPVar1 = &((pXVar4->promiseNode).ptr.ptr)->super_PromiseArenaMember;
      (pXVar4->promiseNode).ptr.ptr = (PromiseNode *)0x0;
      if (pPVar1 != (PromiseArenaMember *)0x0) {
        kj::_::PromiseDisposer::dispose(pPVar1);
      }
      *params_1 = DONE;
      pXVar4 = pXVar3;
    } while (pXVar3 != (XThreadEvent *)0x0);
  }
  pXVar4 = (this->state).value.replies.head.ptr;
  if (pXVar4 != (XThreadEvent *)0x0) {
    this_00 = &(this->state).value.replies;
    if (2 < kj::_::Debug::minSeverity) goto LAB_003fd357;
    kj::_::Debug::log<char_const(&)[64]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
               ,0x36d,ERROR,"\"EventLoop destroyed with cross-thread event replies outstanding\"",
               (char (*) [64])"EventLoop destroyed with cross-thread event replies outstanding");
    pXVar3 = (this_00->head).ptr;
    while (pXVar4 = pXVar3, pXVar3 != (XThreadEvent *)0x0) {
LAB_003fd357:
      pXVar3 = (pXVar4->replyLink).next.ptr;
      List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::replyLink>::remove(this_00,(char *)pXVar4);
    }
  }
  __filename = (this->state).value.fulfilled.head.ptr;
  if (__filename != (XThreadPaf *)0x0) {
    this_01 = &(this->state).value.fulfilled;
    if (kj::_::Debug::minSeverity < 3) {
      kj::_::Debug::log<char_const(&)[68]>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
                 ,0x375,ERROR,
                 "\"EventLoop destroyed with cross-thread fulfiller replies outstanding\"",
                 (char (*) [68])
                 "EventLoop destroyed with cross-thread fulfiller replies outstanding");
      __filename = (this_01->head).ptr;
      if (__filename == (XThreadPaf *)0x0) goto LAB_003fd3d2;
    }
    do {
      pXVar2 = (__filename->link).next.ptr;
      List<kj::_::XThreadPaf,_&kj::_::XThreadPaf::link>::remove(this_01,(char *)__filename);
      __filename->state = DISPATCHED;
      __filename = pXVar2;
    } while (pXVar2 != (XThreadPaf *)0x0);
  }
LAB_003fd3d2:
  kj::_::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++:848:5)>
  ::run(&_kjDefer848);
  return;
}

Assistant:

void disconnect() {
    state.lockExclusive()->loop = kj::none;

    // Now that `loop` is set null in `state`, other threads will no longer try to manipulate our
    // lists, so we can access them without a lock. That's convenient because a bunch of the things
    // we want to do with them would require dropping the lock to avoid deadlocks. We'd end up
    // copying all the lists over into separate vectors first, dropping the lock, operating on
    // them, and then locking again.
    auto& s = state.getWithoutLock();

    // We do, however, take and release the lock on the way out, to make sure anyone performing
    // a conditional wait for state changes gets a chance to have their wait condition re-checked.
    KJ_DEFER(state.lockExclusive());

    for (auto& event: s.start) {
      KJ_ASSERT(event.state == _::XThreadEvent::QUEUED, event.state) { break; }
      s.start.remove(event);
      event.setDisconnected();
      event.sendReply();
      event.setDoneState();
    }

    for (auto& event: s.executing) {
      KJ_ASSERT(event.state == _::XThreadEvent::EXECUTING, event.state) { break; }
      s.executing.remove(event);
      event.promiseNode = kj::none;
      event.setDisconnected();
      event.sendReply();
      event.setDoneState();
    }

    for (auto& event: s.cancel) {
      KJ_ASSERT(event.state == _::XThreadEvent::CANCELING, event.state) { break; }
      s.cancel.remove(event);
      event.promiseNode = kj::none;
      event.setDoneState();
    }

    // The replies list "should" be empty, because any locally-initiated tasks should have been
    // canceled before destroying the EventLoop.
    if (!s.replies.empty()) {
      KJ_LOG(ERROR, "EventLoop destroyed with cross-thread event replies outstanding");
      for (auto& event: s.replies) {
        s.replies.remove(event);
      }
    }

    // Similarly for cross-thread fulfillers. The waiting tasks should have been canceled.
    if (!s.fulfilled.empty()) {
      KJ_LOG(ERROR, "EventLoop destroyed with cross-thread fulfiller replies outstanding");
      for (auto& event: s.fulfilled) {
        s.fulfilled.remove(event);
        event.state = _::XThreadPaf::DISPATCHED;
      }
    }
  }